

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qlistwidget.cpp
# Opt level: O3

int __thiscall QListWidget::qt_metacall(QListWidget *this,Call _c,int _id,void **_a)

{
  uint _id_00;
  
  _id_00 = QListView::qt_metacall(&this->super_QListView,_c,_id,_a);
  if ((-1 < (int)_id_00) && (_c < CustomCall)) {
    if ((0x14eU >> (_c & 0x1f) & 1) == 0) {
      if (_c == InvokeMetaMethod) {
        if (_id_00 < 0xd) {
          qt_static_metacall((QObject *)this,InvokeMetaMethod,_id_00,_a);
        }
      }
      else {
        if (_c != RegisterMethodArgumentMetaType) {
          return _id_00;
        }
        if (_id_00 < 0xd) {
          *(undefined8 *)*_a = 0;
        }
      }
      _id_00 = _id_00 - 0xd;
    }
    else {
      qt_static_metacall((QObject *)this,_c,_id_00,_a);
      _id_00 = _id_00 - 3;
    }
  }
  return _id_00;
}

Assistant:

int QListWidget::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QListView::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 13)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 13;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 13)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 13;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 3;
    }
    return _id;
}